

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  uint uVar1;
  ZSTD_strategy ZVar2;
  ZSTD_compressionParameters cPar;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_40;
  
  ZSTD_getCParams(&local_40,CCtxParams->compressionLevel,srcSizeHint,dictSize);
  if ((CCtxParams->ldmParams).enableLdm != 0) {
    local_40.windowLog = 0x1b;
  }
  uVar1 = (CCtxParams->cParams).windowLog;
  if (uVar1 != 0) {
    local_40.windowLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).hashLog;
  if (uVar1 != 0) {
    local_40.hashLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).chainLog;
  if (uVar1 != 0) {
    local_40.chainLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).searchLog;
  if (uVar1 != 0) {
    local_40.searchLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).minMatch;
  if (uVar1 != 0) {
    local_40.minMatch = uVar1;
  }
  uVar1 = (CCtxParams->cParams).targetLength;
  if (uVar1 != 0) {
    local_40.targetLength = uVar1;
  }
  ZVar2 = (CCtxParams->cParams).strategy;
  if (ZVar2 != 0) {
    local_40.strategy = ZVar2;
  }
  cPar.chainLog = local_40.chainLog;
  cPar.windowLog = local_40.windowLog;
  cPar.strategy = local_40.strategy;
  cPar.targetLength = local_40.targetLength;
  cPar.hashLog = local_40.hashLog;
  cPar.searchLog = local_40.searchLog;
  cPar.minMatch = local_40.minMatch;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.minMatch) cParams.minMatch = CCtxParams->cParams.minMatch;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    assert(!ZSTD_checkCParams(cParams));
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize);
}